

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O3

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr,float *luma,float *refBlackWhite)

{
  char *pcVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  undefined1 auVar19 [16];
  float fVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  
  lVar13 = 0;
  _TIFFmemset(ycbcr + 1,0,0x100);
  ycbcr->clamptab = (TIFFRGBValue *)&ycbcr[6].Cb_b_tab;
  cVar18 = '\0';
  cVar20 = '\x01';
  cVar21 = '\x02';
  cVar22 = '\x03';
  cVar23 = '\x04';
  cVar24 = '\x05';
  cVar25 = '\x06';
  cVar26 = '\a';
  cVar27 = '\b';
  cVar28 = '\t';
  cVar29 = '\n';
  cVar30 = '\v';
  cVar31 = '\f';
  cVar32 = '\r';
  cVar33 = '\x0e';
  cVar34 = '\x0f';
  do {
    pcVar1 = (char *)((long)&ycbcr[6].Cb_b_tab + lVar13);
    *pcVar1 = cVar18;
    pcVar1[1] = cVar20;
    pcVar1[2] = cVar21;
    pcVar1[3] = cVar22;
    pcVar1[4] = cVar23;
    pcVar1[5] = cVar24;
    pcVar1[6] = cVar25;
    pcVar1[7] = cVar26;
    pcVar1[8] = cVar27;
    pcVar1[9] = cVar28;
    pcVar1[10] = cVar29;
    pcVar1[0xb] = cVar30;
    pcVar1[0xc] = cVar31;
    pcVar1[0xd] = cVar32;
    pcVar1[0xe] = cVar33;
    pcVar1[0xf] = cVar34;
    lVar13 = lVar13 + 0x10;
    cVar18 = cVar18 + '\x10';
    cVar20 = cVar20 + '\x10';
    cVar21 = cVar21 + '\x10';
    cVar22 = cVar22 + '\x10';
    cVar23 = cVar23 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
  } while (lVar13 != 0x100);
  _TIFFmemset(&ycbcr[0xb].Cb_g_tab,0xff,0x200);
  ycbcr->Cr_r_tab = (int *)&ycbcr[0x16].Cb_b_tab;
  ycbcr->Cb_b_tab = (int *)&ycbcr[0x2b].Cb_g_tab;
  ycbcr->Cr_g_tab = (int32_t *)(ycbcr + 0x41);
  ycbcr->Cb_g_tab = (int32_t *)&ycbcr[0x56].Cb_b_tab;
  ycbcr->Y_tab = (int32_t *)&ycbcr[0x6b].Cb_g_tab;
  auVar5 = _DAT_00333fa0;
  fVar39 = *luma;
  fVar47 = 2.0;
  fVar35 = 2.0 - (fVar39 + fVar39);
  uVar6 = 0;
  iVar7 = 0;
  if (0.0 <= fVar35) {
    fVar46 = fVar47;
    if (fVar35 <= 2.0) {
      fVar46 = fVar35;
    }
    iVar7 = (int)(fVar46 * 65536.0 + 0.5);
  }
  fVar39 = (fVar39 * fVar35) / luma[1];
  if (0.0 <= fVar39) {
    fVar35 = fVar47;
    if (fVar39 <= 2.0) {
      fVar35 = fVar39;
    }
    uVar6 = (uint)(fVar35 * 65536.0 + 0.5);
  }
  fVar39 = luma[2];
  fVar35 = 2.0 - (fVar39 + fVar39);
  uVar8 = 0;
  iVar9 = 0;
  if (0.0 <= fVar35) {
    if (fVar35 <= 2.0) {
      fVar47 = fVar35;
    }
    iVar9 = (int)(fVar47 * 65536.0 + 0.5);
  }
  fVar39 = (fVar39 * fVar35) / luma[1];
  if (0.0 <= fVar39) {
    fVar47 = 2.0;
    if (fVar39 <= 2.0) {
      fVar47 = fVar39;
    }
    uVar8 = (uint)(fVar47 * 65536.0 + 0.5);
  }
  fVar39 = refBlackWhite[1] - *refBlackWhite;
  uVar14 = -(uint)(fVar39 != 0.0);
  uVar36 = ~uVar14 & 0x3f800000 | (uint)fVar39 & uVar14;
  iVar10 = (int)*refBlackWhite;
  fVar39 = (float)*(undefined8 *)(refBlackWhite + 2) + -128.0;
  fVar47 = ((float)((ulong)*(undefined8 *)(refBlackWhite + 2) >> 0x20) + -128.0) - fVar39;
  uVar14 = -(uint)(fVar47 != 0.0);
  uVar40 = ~uVar14 & 0x3f800000 | (uint)fVar47 & uVar14;
  iVar11 = (int)fVar39;
  fVar39 = (float)*(undefined8 *)(refBlackWhite + 4) + -128.0;
  fVar47 = ((float)((ulong)*(undefined8 *)(refBlackWhite + 4) >> 0x20) + -128.0) - fVar39;
  uVar14 = -(uint)(fVar47 != 0.0);
  uVar14 = ~uVar14 & 0x3f800000 | (uint)fVar47 & uVar14;
  iVar12 = (int)fVar39;
  auVar41._4_4_ = uVar36;
  auVar41._0_4_ = uVar36;
  auVar41._8_4_ = uVar36;
  auVar41._12_4_ = uVar36;
  iVar48 = -0x80;
  iVar49 = -0x7f;
  iVar50 = -0x7e;
  iVar51 = -0x7d;
  lVar13 = -0x100;
  do {
    auVar42._0_4_ = (float)(iVar48 - iVar12) * 127.0;
    auVar42._4_4_ = (float)(iVar49 - iVar12) * 127.0;
    auVar42._8_4_ = (float)(iVar50 - iVar12) * 127.0;
    auVar42._12_4_ = (float)(iVar51 - iVar12) * 127.0;
    auVar4._4_4_ = uVar14;
    auVar4._0_4_ = uVar14;
    auVar4._8_4_ = uVar14;
    auVar4._12_4_ = uVar14;
    auVar43 = divps(auVar42,auVar4);
    auVar54 = minps(auVar5,auVar43);
    uVar36 = -(uint)(auVar43._0_4_ < -4096.0);
    uVar15 = -(uint)(auVar43._4_4_ < -4096.0);
    uVar16 = -(uint)(auVar43._8_4_ < -4096.0);
    uVar17 = -(uint)(auVar43._12_4_ < -4096.0);
    auVar55._0_4_ = (int)(float)(~uVar36 & auVar54._0_4_ | uVar36 & 0xc5800000);
    auVar55._4_4_ = (int)(float)(~uVar15 & auVar54._4_4_ | uVar15 & 0xc5800000);
    auVar55._8_4_ = (uint)(float)(~uVar16 & auVar54._8_4_ | uVar16 & 0xc5800000);
    auVar55._12_4_ = (uint)(float)(~uVar17 & auVar54._12_4_ | uVar17 & 0xc5800000);
    auVar44._0_4_ = (float)(iVar48 - iVar11) * 127.0;
    auVar44._4_4_ = (float)(iVar49 - iVar11) * 127.0;
    auVar44._8_4_ = (float)(iVar50 - iVar11) * 127.0;
    auVar44._12_4_ = (float)(iVar51 - iVar11) * 127.0;
    auVar3._4_4_ = uVar40;
    auVar3._0_4_ = uVar40;
    auVar3._8_4_ = uVar40;
    auVar3._12_4_ = uVar40;
    auVar43 = divps(auVar44,auVar3);
    auVar54 = minps(auVar5,auVar43);
    uVar36 = -(uint)(auVar43._0_4_ < -4096.0);
    uVar15 = -(uint)(auVar43._4_4_ < -4096.0);
    uVar16 = -(uint)(auVar43._8_4_ < -4096.0);
    uVar17 = -(uint)(auVar43._12_4_ < -4096.0);
    auVar45._0_4_ = (int)(float)(~uVar36 & auVar54._0_4_ | uVar36 & 0xc5800000);
    auVar45._4_4_ = (int)(float)(~uVar15 & auVar54._4_4_ | uVar15 & 0xc5800000);
    auVar45._8_4_ = (uint)(float)(~uVar16 & auVar54._8_4_ | uVar16 & 0xc5800000);
    auVar45._12_4_ = (uint)(float)(~uVar17 & auVar54._12_4_ | uVar17 & 0xc5800000);
    auVar43._4_4_ = iVar7;
    auVar43._0_4_ = iVar7;
    auVar43._8_4_ = iVar7;
    auVar43._12_4_ = iVar7;
    auVar52._4_4_ = iVar7;
    auVar52._0_4_ = iVar7;
    auVar52._8_4_ = iVar7;
    auVar52._12_4_ = iVar7;
    piVar2 = (int *)((long)&ycbcr[0x2b].Cb_g_tab + lVar13 * 4);
    *piVar2 = iVar7 * auVar55._0_4_ + 0x8000 >> 0x10;
    piVar2[1] = iVar7 * auVar55._4_4_ + 0x8000 >> 0x10;
    piVar2[2] = (int)((auVar43._8_8_ & 0xffffffff) * (ulong)auVar55._8_4_) + 0x8000 >> 0x10;
    piVar2[3] = (int)((auVar52._8_8_ & 0xffffffff) * (ulong)auVar55._12_4_) + 0x8000 >> 0x10;
    auVar54._4_4_ = iVar9;
    auVar54._0_4_ = iVar9;
    auVar54._8_4_ = iVar9;
    auVar54._12_4_ = iVar9;
    auVar53._4_4_ = iVar9;
    auVar53._0_4_ = iVar9;
    auVar53._8_4_ = iVar9;
    auVar53._12_4_ = iVar9;
    piVar2 = (int *)((long)&ycbcr[0x41].clamptab + lVar13 * 4);
    *piVar2 = iVar9 * auVar45._0_4_ + 0x8000 >> 0x10;
    piVar2[1] = iVar9 * auVar45._4_4_ + 0x8000 >> 0x10;
    piVar2[2] = (int)((auVar54._8_8_ & 0xffffffff) * (ulong)auVar45._8_4_) + 0x8000 >> 0x10;
    piVar2[3] = (int)((auVar53._8_8_ & 0xffffffff) * (ulong)auVar45._12_4_) + 0x8000 >> 0x10;
    auVar37._4_4_ = uVar6;
    auVar37._0_4_ = uVar6;
    auVar37._8_4_ = uVar6;
    auVar37._12_4_ = uVar6;
    piVar2 = (int *)((long)&ycbcr[0x56].Cb_b_tab + lVar13 * 4);
    *piVar2 = -(auVar55._0_4_ * uVar6);
    piVar2[1] = -(uVar6 * auVar55._4_4_);
    piVar2[2] = -(int)((auVar55._8_8_ & 0xffffffff) * (ulong)uVar6);
    piVar2[3] = -(int)((auVar37._8_8_ & 0xffffffff) * (ulong)auVar55._12_4_);
    auVar38._4_4_ = uVar8;
    auVar38._0_4_ = uVar8;
    auVar38._8_4_ = uVar8;
    auVar38._12_4_ = uVar8;
    piVar2 = (int *)((long)&ycbcr[0x6b].Cb_g_tab + lVar13 * 4);
    *piVar2 = 0x8000 - auVar45._0_4_ * uVar8;
    piVar2[1] = 0x8000 - uVar8 * auVar45._4_4_;
    piVar2[2] = 0x8000 - (int)((auVar45._8_8_ & 0xffffffff) * (ulong)uVar8);
    piVar2[3] = 0x8000 - (int)((auVar38._8_8_ & 0xffffffff) * (ulong)auVar45._12_4_);
    auVar19._0_4_ = (float)((iVar48 - iVar10) + 0x80) * 255.0;
    auVar19._4_4_ = (float)((iVar49 - iVar10) + 0x80) * 255.0;
    auVar19._8_4_ = (float)((iVar50 - iVar10) + 0x80) * 255.0;
    auVar19._12_4_ = (float)((iVar51 - iVar10) + 0x80) * 255.0;
    auVar43 = divps(auVar19,auVar41);
    auVar54 = minps(auVar5,auVar43);
    uVar36 = -(uint)(auVar43._0_4_ < -4096.0);
    uVar15 = -(uint)(auVar43._4_4_ < -4096.0);
    uVar16 = -(uint)(auVar43._8_4_ < -4096.0);
    uVar17 = -(uint)(auVar43._12_4_ < -4096.0);
    piVar2 = (int *)((long)&ycbcr[0x81].clamptab + lVar13 * 4);
    *piVar2 = (int)(float)(~uVar36 & auVar54._0_4_ | uVar36 & 0xc5800000);
    piVar2[1] = (int)(float)(~uVar15 & auVar54._4_4_ | uVar15 & 0xc5800000);
    piVar2[2] = (int)(float)(~uVar16 & auVar54._8_4_ | uVar16 & 0xc5800000);
    piVar2[3] = (int)(float)(~uVar17 & auVar54._12_4_ | uVar17 & 0xc5800000);
    iVar48 = iVar48 + 4;
    iVar49 = iVar49 + 4;
    iVar50 = iVar50 + 4;
    iVar51 = iVar51 + 4;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0);
  return 0;
}

Assistant:

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr, float *luma, float *refBlackWhite)
{
    TIFFRGBValue *clamptab;
    int i;

#define LumaRed luma[0]
#define LumaGreen luma[1]
#define LumaBlue luma[2]

    clamptab =
        (TIFFRGBValue *)((uint8_t *)ycbcr +
                         TIFFroundup_32(sizeof(TIFFYCbCrToRGB), sizeof(long)));
    _TIFFmemset(clamptab, 0, 256); /* v < 0 => 0 */
    ycbcr->clamptab = (clamptab += 256);
    for (i = 0; i < 256; i++)
        clamptab[i] = (TIFFRGBValue)i;
    _TIFFmemset(clamptab + 256, 255, 2 * 256); /* v > 255 => 255 */
    ycbcr->Cr_r_tab = (int *)(clamptab + 3 * 256);
    ycbcr->Cb_b_tab = ycbcr->Cr_r_tab + 256;
    ycbcr->Cr_g_tab = (int32_t *)(ycbcr->Cb_b_tab + 256);
    ycbcr->Cb_g_tab = ycbcr->Cr_g_tab + 256;
    ycbcr->Y_tab = ycbcr->Cb_g_tab + 256;

    {
        float f1 = 2 - 2 * LumaRed;
        int32_t D1 = FIX(CLAMP(f1, 0.0F, 2.0F));
        float f2 = LumaRed * f1 / LumaGreen;
        int32_t D2 = -FIX(CLAMP(f2, 0.0F, 2.0F));
        float f3 = 2 - 2 * LumaBlue;
        int32_t D3 = FIX(CLAMP(f3, 0.0F, 2.0F));
        float f4 = LumaBlue * f3 / LumaGreen;
        int32_t D4 = -FIX(CLAMP(f4, 0.0F, 2.0F));
        int x;

#undef LumaBlue
#undef LumaGreen
#undef LumaRed

        /*
         * i is the actual input pixel value in the range 0..255
         * Cb and Cr values are in the range -128..127 (actually
         * they are in a range defined by the ReferenceBlackWhite
         * tag) so there is some range shifting to do here when
         * constructing tables indexed by the raw pixel data.
         */
        for (i = 0, x = -128; i < 256; i++, x++)
        {
            int32_t Cr = (int32_t)CLAMPw(Code2V(x, refBlackWhite[4] - 128.0F,
                                                refBlackWhite[5] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);
            int32_t Cb = (int32_t)CLAMPw(Code2V(x, refBlackWhite[2] - 128.0F,
                                                refBlackWhite[3] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);

            ycbcr->Cr_r_tab[i] = (int32_t)((D1 * Cr + ONE_HALF) >> SHIFT);
            ycbcr->Cb_b_tab[i] = (int32_t)((D3 * Cb + ONE_HALF) >> SHIFT);
            ycbcr->Cr_g_tab[i] = D2 * Cr;
            ycbcr->Cb_g_tab[i] = D4 * Cb + ONE_HALF;
            ycbcr->Y_tab[i] = (int32_t)CLAMPw(
                Code2V(x + 128, refBlackWhite[0], refBlackWhite[1], 255),
                -128.0F * 32, 128.0F * 32);
        }
    }

    return 0;
}